

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_aco.cpp
# Opt level: O2

void aco_resume(aco_t *resume_co)

{
  size_t *psVar1;
  aco_t *paVar2;
  aco_share_stack_t *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  void *pvVar19;
  aco_share_stack_t *paVar20;
  undefined8 *puVar21;
  ulong __size;
  undefined8 *puVar22;
  ulong uVar23;
  aco_t *paVar24;
  
  if (((resume_co == (aco_t *)0x0) || (paVar24 = resume_co->main_co, paVar24 == (aco_t *)0x0)) ||
     (resume_co->is_end != '\0')) goto LAB_00129aa3;
  paVar20 = resume_co->share_stack;
  paVar2 = paVar20->owner;
  if (paVar2 != resume_co) {
    if (paVar2 != (aco_t *)0x0) {
      paVar3 = paVar2->share_stack;
      if (paVar3 != paVar20) goto LAB_00129aa3;
      pvVar19 = paVar2->reg[5];
      uVar23 = (long)paVar3->align_retptr - (long)pvVar19;
      if ((paVar3->align_retptr < pvVar19) ||
         (pvVar19 < (void *)((long)paVar3->align_highptr - paVar3->align_limit))) goto LAB_00129aa3;
      (paVar2->save_stack).valid_sz = uVar23;
      if ((paVar2->save_stack).sz < uVar23) {
        free((paVar2->save_stack).ptr);
        (paVar2->save_stack).ptr = (void *)0x0;
        __size = (paVar2->save_stack).sz;
        do {
          __size = __size * 2;
          if (__size == 0) {
            (paVar2->save_stack).sz = 0;
            goto LAB_00129aa3;
          }
          uVar23 = (paVar2->save_stack).valid_sz;
        } while (__size < uVar23);
        (paVar2->save_stack).sz = __size;
        pvVar19 = malloc(__size);
        (paVar2->save_stack).ptr = pvVar19;
        if (pvVar19 == (void *)0x0) {
          fprintf(_stderr,"Aborting: failed to allocate memory: %s:%d:%s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CandyMi[P]libeco/lib/eco_aco.cpp"
                  ,0x1a2,"void aco_resume(aco_t *)");
          abort();
        }
      }
      if (uVar23 != 0) {
        puVar21 = (undefined8 *)paVar2->reg[5];
        puVar22 = (undefined8 *)(paVar2->save_stack).ptr;
        if (((((ulong)puVar21 & 0xf) == 0) && (uVar23 < 0x90)) &&
           ((((uint)uVar23 & 0xf) == 8 && (((ulong)puVar22 & 0xf) == 0)))) {
          switch(uVar23 >> 4) {
          case 1:
            uVar4 = puVar21[1];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            break;
          case 2:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            break;
          case 3:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            break;
          case 4:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            uVar9 = puVar21[7];
            uVar10 = puVar21[6];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            puVar22[6] = uVar10;
            puVar22[7] = uVar9;
            break;
          case 5:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            uVar9 = puVar21[7];
            uVar10 = puVar21[6];
            uVar11 = puVar21[9];
            uVar12 = puVar21[8];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            puVar22[6] = uVar10;
            puVar22[7] = uVar9;
            puVar22[8] = uVar12;
            puVar22[9] = uVar11;
            break;
          case 6:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            uVar9 = puVar21[7];
            uVar10 = puVar21[6];
            uVar11 = puVar21[9];
            uVar12 = puVar21[8];
            uVar13 = puVar21[0xb];
            uVar14 = puVar21[10];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            puVar22[6] = uVar10;
            puVar22[7] = uVar9;
            puVar22[8] = uVar12;
            puVar22[9] = uVar11;
            puVar22[10] = uVar14;
            puVar22[0xb] = uVar13;
            break;
          case 7:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            uVar9 = puVar21[7];
            uVar10 = puVar21[6];
            uVar11 = puVar21[9];
            uVar12 = puVar21[8];
            uVar13 = puVar21[0xb];
            uVar14 = puVar21[10];
            uVar15 = puVar21[0xd];
            uVar16 = puVar21[0xc];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            puVar22[6] = uVar10;
            puVar22[7] = uVar9;
            puVar22[8] = uVar12;
            puVar22[9] = uVar11;
            puVar22[10] = uVar14;
            puVar22[0xb] = uVar13;
            puVar22[0xc] = uVar16;
            puVar22[0xd] = uVar15;
            break;
          case 8:
            uVar4 = puVar21[1];
            uVar5 = puVar21[3];
            uVar6 = puVar21[2];
            uVar7 = puVar21[5];
            uVar8 = puVar21[4];
            uVar9 = puVar21[7];
            uVar10 = puVar21[6];
            uVar11 = puVar21[9];
            uVar12 = puVar21[8];
            uVar13 = puVar21[0xb];
            uVar14 = puVar21[10];
            uVar15 = puVar21[0xd];
            uVar16 = puVar21[0xc];
            uVar17 = puVar21[0xf];
            uVar18 = puVar21[0xe];
            *puVar22 = *puVar21;
            puVar22[1] = uVar4;
            puVar22[2] = uVar6;
            puVar22[3] = uVar5;
            puVar22[4] = uVar8;
            puVar22[5] = uVar7;
            puVar22[6] = uVar10;
            puVar22[7] = uVar9;
            puVar22[8] = uVar12;
            puVar22[9] = uVar11;
            puVar22[10] = uVar14;
            puVar22[0xb] = uVar13;
            puVar22[0xc] = uVar16;
            puVar22[0xd] = uVar15;
            puVar22[0xe] = uVar18;
            puVar22[0xf] = uVar17;
          }
          *(undefined8 *)((uVar23 - 8) + (long)puVar22) =
               *(undefined8 *)((uVar23 - 8) + (long)puVar21);
        }
        else {
          memcpy(puVar22,puVar21,uVar23);
        }
        psVar1 = &(paVar2->save_stack).ct_save;
        *psVar1 = *psVar1 + 1;
        uVar23 = (paVar2->save_stack).valid_sz;
        if ((paVar2->save_stack).max_cpsz < uVar23) {
          (paVar2->save_stack).max_cpsz = uVar23;
        }
      }
      paVar20 = paVar2->share_stack;
      paVar20->owner = (aco_t *)0x0;
      paVar20->align_validsz = 0;
      paVar20 = resume_co->share_stack;
      if (paVar20->owner != (aco_t *)0x0) goto LAB_00129aa3;
    }
    uVar23 = (resume_co->save_stack).valid_sz;
    if (paVar20->align_limit - 8 < uVar23) {
LAB_00129aa3:
      abort();
    }
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      puVar21 = (undefined8 *)(resume_co->save_stack).ptr;
      pvVar19 = paVar20->align_retptr;
      puVar22 = (undefined8 *)((long)pvVar19 - uVar23);
      if ((((((ulong)puVar21 & 0xf) == 0) && (uVar23 < 0x90)) && (((uint)uVar23 & 0xf) == 8)) &&
         (((ulong)puVar22 & 0xf) == 0)) {
        switch(uVar23 >> 4) {
        case 1:
          uVar4 = puVar21[1];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          break;
        case 2:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          break;
        case 3:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          break;
        case 4:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          uVar9 = puVar21[7];
          uVar10 = puVar21[6];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          puVar22[6] = uVar10;
          puVar22[7] = uVar9;
          break;
        case 5:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          uVar9 = puVar21[7];
          uVar10 = puVar21[6];
          uVar11 = puVar21[9];
          uVar12 = puVar21[8];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          puVar22[6] = uVar10;
          puVar22[7] = uVar9;
          puVar22[8] = uVar12;
          puVar22[9] = uVar11;
          break;
        case 6:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          uVar9 = puVar21[7];
          uVar10 = puVar21[6];
          uVar11 = puVar21[9];
          uVar12 = puVar21[8];
          uVar13 = puVar21[0xb];
          uVar14 = puVar21[10];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          puVar22[6] = uVar10;
          puVar22[7] = uVar9;
          puVar22[8] = uVar12;
          puVar22[9] = uVar11;
          puVar22[10] = uVar14;
          puVar22[0xb] = uVar13;
          break;
        case 7:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          uVar9 = puVar21[7];
          uVar10 = puVar21[6];
          uVar11 = puVar21[9];
          uVar12 = puVar21[8];
          uVar13 = puVar21[0xb];
          uVar14 = puVar21[10];
          uVar15 = puVar21[0xd];
          uVar16 = puVar21[0xc];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          puVar22[6] = uVar10;
          puVar22[7] = uVar9;
          puVar22[8] = uVar12;
          puVar22[9] = uVar11;
          puVar22[10] = uVar14;
          puVar22[0xb] = uVar13;
          puVar22[0xc] = uVar16;
          puVar22[0xd] = uVar15;
          break;
        case 8:
          uVar4 = puVar21[1];
          uVar5 = puVar21[3];
          uVar6 = puVar21[2];
          uVar7 = puVar21[5];
          uVar8 = puVar21[4];
          uVar9 = puVar21[7];
          uVar10 = puVar21[6];
          uVar11 = puVar21[9];
          uVar12 = puVar21[8];
          uVar13 = puVar21[0xb];
          uVar14 = puVar21[10];
          uVar15 = puVar21[0xd];
          uVar16 = puVar21[0xc];
          uVar17 = puVar21[0xf];
          uVar18 = puVar21[0xe];
          *puVar22 = *puVar21;
          puVar22[1] = uVar4;
          puVar22[2] = uVar6;
          puVar22[3] = uVar5;
          puVar22[4] = uVar8;
          puVar22[5] = uVar7;
          puVar22[6] = uVar10;
          puVar22[7] = uVar9;
          puVar22[8] = uVar12;
          puVar22[9] = uVar11;
          puVar22[10] = uVar14;
          puVar22[0xb] = uVar13;
          puVar22[0xc] = uVar16;
          puVar22[0xd] = uVar15;
          puVar22[0xe] = uVar18;
          puVar22[0xf] = uVar17;
        }
        *(undefined8 *)((long)pvVar19 + -8) = *(undefined8 *)((uVar23 - 8) + (long)puVar21);
      }
      else {
        memcpy(puVar22,puVar21,uVar23);
      }
      psVar1 = &(resume_co->save_stack).ct_restore;
      *psVar1 = *psVar1 + 1;
      uVar23 = (resume_co->save_stack).valid_sz;
      if ((resume_co->save_stack).max_cpsz < uVar23) {
        (resume_co->save_stack).max_cpsz = uVar23;
      }
    }
    paVar20 = resume_co->share_stack;
    paVar20->align_validsz = uVar23 + 8;
    paVar20->owner = resume_co;
    paVar24 = resume_co->main_co;
  }
  puVar21 = (undefined8 *)__tls_get_addr(&PTR_00144f68);
  *puVar21 = resume_co;
  acosw(paVar24,resume_co);
  *puVar21 = resume_co->main_co;
  return;
}

Assistant:

aco_attr_no_asan
void aco_resume(aco_t* resume_co){
    assert(resume_co != nullptr && resume_co->main_co != nullptr
        && resume_co->is_end == 0
    );
    if(resume_co->share_stack->owner != resume_co){
        if(resume_co->share_stack->owner != nullptr){
            aco_t* owner_co = resume_co->share_stack->owner;
            assert(owner_co->share_stack == resume_co->share_stack);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
            assert(
                (
                    (uintptr_t)(owner_co->share_stack->align_retptr)
                    >=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
                &&
                (
                    (uintptr_t)(owner_co->share_stack->align_highptr)
                    -
                    (uintptr_t)(owner_co->share_stack->align_limit)
                    <=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
            );
            owner_co->save_stack.valid_sz =
                (uintptr_t)(owner_co->share_stack->align_retptr)
                -
                (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP]);
            if(owner_co->save_stack.sz < owner_co->save_stack.valid_sz){
                eco_free(owner_co->save_stack.ptr);
                owner_co->save_stack.ptr = nullptr;
                while(1){
                    owner_co->save_stack.sz = owner_co->save_stack.sz << 1;
                    assert(owner_co->save_stack.sz > 0);
                    if(owner_co->save_stack.sz >= owner_co->save_stack.valid_sz){
                        break;
                    }
                }
                owner_co->save_stack.ptr = eco_malloc(owner_co->save_stack.sz);
                assertalloc_ptr(owner_co->save_stack.ptr);
            }
            // TODO: optimize the performance penalty of memcpy function call
            //   for very short memory span
            if(owner_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
                aco_amd64_optimized_memcpy_drop_in(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #else
                memcpy(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #endif
                owner_co->save_stack.ct_save++;
            }
            if(owner_co->save_stack.valid_sz > owner_co->save_stack.max_cpsz){
                owner_co->save_stack.max_cpsz = owner_co->save_stack.valid_sz;
            }
            owner_co->share_stack->owner = nullptr;
            owner_co->share_stack->align_validsz = 0;
#else
            #error "platform no support yet"
#endif
        }
        assert(resume_co->share_stack->owner == nullptr);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
        assert(
            resume_co->save_stack.valid_sz
            <=
            resume_co->share_stack->align_limit - sizeof(void*)
        );
        // TODO: optimize the performance penalty of memcpy function call
        //   for very short memory span
        if(resume_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
            aco_amd64_optimized_memcpy_drop_in(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #else
            memcpy(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #endif
            resume_co->save_stack.ct_restore++;
        }
        if(resume_co->save_stack.valid_sz > resume_co->save_stack.max_cpsz){
            resume_co->save_stack.max_cpsz = resume_co->save_stack.valid_sz;
        }
        resume_co->share_stack->align_validsz = resume_co->save_stack.valid_sz + sizeof(void*);
        resume_co->share_stack->owner = resume_co;
#else
        #error "platform no support yet"
#endif
    }
    aco_gtls_co = resume_co;
    acosw(resume_co->main_co, resume_co);
    aco_gtls_co = resume_co->main_co;
}